

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufferAdd(xmlBufferPtr buf,xmlChar *str,int len)

{
  int iVar1;
  uint local_24;
  int len_local;
  xmlChar *str_local;
  xmlBufferPtr buf_local;
  
  if ((buf == (xmlBufferPtr)0x0) || (str == (xmlChar *)0x0)) {
    buf_local._4_4_ = 0x73;
  }
  else {
    local_24 = len;
    if (len < 0) {
      local_24 = xmlStrlen(str);
    }
    if (local_24 == 0) {
      buf_local._4_4_ = 0;
    }
    else if ((local_24 < buf->size - buf->use) || (iVar1 = xmlBufferGrow(buf,local_24), -1 < iVar1))
    {
      memmove(buf->content + buf->use,str,(long)(int)local_24);
      buf->use = local_24 + buf->use;
      buf->content[buf->use] = '\0';
      buf_local._4_4_ = 0;
    }
    else {
      buf_local._4_4_ = 2;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferAdd(xmlBufferPtr buf, const xmlChar *str, int len) {
    if ((buf == NULL) || (str == NULL))
	return(XML_ERR_ARGUMENT);
    if (len < 0)
        len = xmlStrlen(str);
    if (len == 0)
        return(XML_ERR_OK);

    /* Note that both buf->size and buf->use can be zero here. */
    if ((unsigned) len >= buf->size - buf->use) {
        if (xmlBufferGrow(buf, len) < 0)
            return(XML_ERR_NO_MEMORY);
    }

    memmove(&buf->content[buf->use], str, len);
    buf->use += len;
    buf->content[buf->use] = 0;
    return(XML_ERR_OK);
}